

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O1

bool bcache_remove_file(filemgr *file)

{
  fnamedic_item *fname;
  size_t sVar1;
  fnamedic_item **ppfVar2;
  FILE *__stream;
  bool bVar3;
  int iVar4;
  uint __errnum;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  
  _garbage_collect_zombie_fnames();
  fname = (file->bcache)._M_b._M_p;
  if (fname != (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    bVar3 = _file_empty(fname);
    if (bVar3) {
      hash_remove(&fnamedic,&fname->hash_elem);
      pthread_spin_unlock(&bcache_lock);
      iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)&filelist_lock);
      ppfVar2 = file_list;
      sVar1 = num_files;
      if (iVar4 == 0) {
        if (num_files == 0) {
          bVar3 = false;
        }
        else {
          bVar3 = false;
          uVar6 = 1;
          do {
            if (ppfVar2[uVar6 - 1] == fname) {
              bVar3 = true;
            }
            if ((bVar3) && (uVar6 < sVar1)) {
              ppfVar2[uVar6 - 1] = ppfVar2[uVar6];
            }
            bVar7 = uVar6 != sVar1;
            uVar6 = uVar6 + 1;
          } while (bVar7);
        }
        if (bVar3) {
          file_list[sVar1 - 1] = (fnamedic_item *)0x0;
          num_files = sVar1 - 1;
          bVar7 = (fname->ref_count).super___atomic_base<unsigned_int>._M_i == 0;
          if (!bVar7) {
            list_push_front(&file_zombies,&fname->le);
          }
          __errnum = pthread_rwlock_unlock((pthread_rwlock_t *)&filelist_lock);
        }
        else {
          __errnum = pthread_rwlock_unlock((pthread_rwlock_t *)&filelist_lock);
          bVar7 = true;
        }
        __stream = _stderr;
        if (__errnum != 0) {
          pcVar5 = strerror(__errnum);
          fprintf(__stream,"pthread_rwlock_unlock returned %d (%s)\n",(ulong)__errnum,pcVar5);
        }
        if (!(bool)(bVar3 & bVar7)) {
          return false;
        }
      }
      else {
        bcache_remove_file_cold_1();
      }
      _fname_free(fname);
      return true;
    }
    pthread_spin_unlock(&bcache_lock);
  }
  return false;
}

Assistant:

bool bcache_remove_file(struct filemgr *file)
{
    bool rv = false;
    struct fnamedic_item *fname_item;

    // Before proceeding with deletion, garbage collect zombie files
    _garbage_collect_zombie_fnames();
    fname_item = file->bcache;

    if (fname_item) {
        // acquire lock
        spin_lock(&bcache_lock);
        // file must be empty
        if (!_file_empty(fname_item)) {
            spin_unlock(&bcache_lock);
            DBG("Warning: failed to remove fnamedic_item instance for a file '%s' "
                "because the fnamedic_item instance is not empty!\n",
                file->filename);
            return rv;
        }

        // remove from fname dictionary hash table
        hash_remove(&fnamedic, &fname_item->hash_elem);
        spin_unlock(&bcache_lock);

        // We don't need to grab the file buffer cache's partition locks
        // at once because this function is only invoked when there are
        // no database handles that access the file.
        if (_fname_try_free(fname_item)) {
            _fname_free(fname_item); // no other callers accessing this file
            rv = true;
        } // else fnamedic_item is in use by _bcache_evict. Deletion delayed
    }
    return rv;
}